

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geofile_operations.cpp
# Opt level: O3

int __thiscall
GEO::geofile::import_line
          (geofile *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *split_string_vector,string *import_path,int *line_number)

{
  pointer pbVar1;
  char *pcVar2;
  bool bVar3;
  uint *puVar4;
  long lVar5;
  long lVar6;
  ostream *poVar7;
  undefined8 uVar8;
  uint uVar9;
  uint uVar10;
  pair<const_int,_GEO::line> *__endptr;
  pair<const_int,_GEO::line> local_48;
  long local_38;
  
  pbVar1 = (split_string_vector->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  bVar3 = is_integer(pbVar1 + 1);
  if (!bVar3) {
LAB_0012c9bf:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Error: Invalid value (line ",0x1b);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*line_number);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," of ",4);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,(import_path->_M_dataplus)._M_p,import_path->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    return 1;
  }
  bVar3 = is_integer(pbVar1 + 2);
  if ((!bVar3) || (bVar3 = is_integer(pbVar1 + 3), !bVar3)) goto LAB_0012c9bf;
  pcVar2 = pbVar1[2]._M_dataplus._M_p;
  puVar4 = (uint *)__errno_location();
  uVar10 = *puVar4;
  *puVar4 = 0;
  __endptr = &local_48;
  lVar5 = strtol(pcVar2,(char **)__endptr,10);
  if ((char *)CONCAT44(local_48.second.start,local_48.first) == pcVar2) {
    std::__throw_invalid_argument("stoi");
LAB_0012ca6a:
    std::__throw_out_of_range("stoi");
LAB_0012ca76:
    std::__throw_invalid_argument("stoi");
LAB_0012ca82:
    uVar10 = (uint)__endptr;
    std::__throw_out_of_range("stoi");
  }
  else {
    if (((int)lVar5 != lVar5) || (uVar9 = *puVar4, uVar9 == 0x22)) goto LAB_0012ca6a;
    if (uVar9 == 0) {
      *puVar4 = uVar10;
      uVar9 = uVar10;
    }
    __endptr = (pair<const_int,_GEO::line> *)
               (split_string_vector->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start[3]._M_dataplus._M_p;
    *puVar4 = 0;
    local_38 = lVar5;
    lVar5 = strtol((char *)__endptr,(char **)&local_48,10);
    if ((pair<const_int,_GEO::line> *)CONCAT44(local_48.second.start,local_48.first) == __endptr)
    goto LAB_0012ca76;
    if (lVar5 - 0x80000000U < 0xffffffff00000000) goto LAB_0012ca82;
    uVar10 = *puVar4;
    __endptr = (pair<const_int,_GEO::line> *)(ulong)uVar10;
    if (uVar10 == 0x22) goto LAB_0012ca82;
    if (uVar10 == 0) {
      *puVar4 = uVar9;
      uVar10 = uVar9;
    }
    pcVar2 = (split_string_vector->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
    *puVar4 = 0;
    lVar6 = strtol(pcVar2,(char **)&local_48,10);
    if ((char *)CONCAT44(local_48.second.start,local_48.first) != pcVar2) {
      if ((0xfffffffeffffffff < lVar6 - 0x80000000U) && (*puVar4 != 0x22)) {
        if (*puVar4 == 0) {
          *puVar4 = uVar10;
        }
        local_48.first = (int)lVar6;
        local_48.second.start = (int)local_38;
        local_48.second.end = (int)lVar5;
        std::
        _Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
        ::_M_insert_unique<std::pair<int_const,GEO::line>>
                  ((_Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
                    *)&this->lines_map,&local_48);
        return 0;
      }
      goto LAB_0012ca9a;
    }
  }
  std::__throw_invalid_argument("stoi");
LAB_0012ca9a:
  uVar8 = std::__throw_out_of_range("stoi");
  if (*puVar4 == 0) {
    *puVar4 = uVar10;
  }
  _Unwind_Resume(uVar8);
}

Assistant:

int GEO::geofile::import_line( std::vector<std::string> &split_string_vector,
                                std::string &import_path,
                                int &line_number)
{
    if ((is_integer(split_string_vector[1])==true)&&
        (is_integer(split_string_vector[2])==true)&&
        (is_integer(split_string_vector[3])==true))
    {
        line input_line;
        auto start = std::stoi(split_string_vector[2]);
        auto end   = std::stoi(split_string_vector[3]);
        input_line.start = start;
        input_line.end = end;
        lines_map.insert({std::stoi(split_string_vector[1]), input_line});
        return EXIT_SUCCESS;
    }
    else
    {
        std::cout << "Error: Invalid value (line "
        << line_number << " of "
        << import_path << ")" << std::endl;
        return EXIT_FAILURE;
    }
    return EXIT_SUCCESS;
}